

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen.cpp
# Opt level: O1

PrimInfoMB *
embree::sse2::createPrimRefArrayMSMBlur
          (PrimInfoMB *__return_storage_ptr__,Scene *scene,GTypeMask types,size_t numPrimRefs,
          mvector<PrimRefMB> *prims,mvector<SubGridBuildData> *sgrids,
          BuildProgressMonitor *progressMonitor,BBox1f t0t1)

{
  float fVar1;
  Geometry *pGVar2;
  unsigned_long uVar3;
  size_t sVar4;
  size_t sVar5;
  BBox1f BVar6;
  char cVar7;
  int iVar8;
  ulong uVar9;
  task *ptVar10;
  runtime_error *prVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  size_t sVar15;
  ulong uVar16;
  ulong uVar17;
  undefined1 (*pauVar18) [16];
  float *pfVar19;
  size_t sVar20;
  _func_int **pp_Var21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  bool bVar25;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar26;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar27;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar28;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar29;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar30;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar31;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar32;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar33;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar34;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar35;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar36;
  float fVar37;
  float fVar38;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar39;
  BBox1f BVar40;
  unsigned_long uVar41;
  unsigned_long uVar42;
  float fVar43;
  BBox1f BVar44;
  small_object_allocator alloc;
  Iterator2 iter;
  task_group_context context;
  ParallelForForPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> pstate;
  undefined1 local_4e31;
  _func_int **local_4e30;
  BBox1f local_4e28;
  long **local_4e20;
  task_traits local_4e18;
  Scene *local_4e10;
  GTypeMask local_4e08;
  char local_4e00;
  mvector<PrimRefMB> *local_4df8;
  mvector<SubGridBuildData> *local_4df0;
  Scene **local_4de8;
  size_t local_4de0;
  mvector<PrimRefMB> **local_4dd8;
  Scene **local_4dd0;
  undefined8 local_4dc8;
  undefined8 uStack_4dc0;
  undefined8 local_4db8;
  undefined8 uStack_4db0;
  undefined8 local_4da8;
  undefined8 uStack_4da0;
  undefined8 local_4d98;
  undefined8 uStack_4d90;
  undefined8 local_4d88;
  undefined8 uStack_4d80;
  undefined8 local_4d78;
  undefined8 uStack_4d70;
  unsigned_long local_4d68;
  unsigned_long uStack_4d60;
  size_t local_4d58;
  size_t sStack_4d50;
  float local_4d48;
  float fStack_4d44;
  float fStack_4d40;
  float fStack_4d3c;
  mvector<PrimRefMB> *local_4d30;
  mvector<SubGridBuildData> *local_4d28;
  BBox1f *local_4d20;
  long *local_4d18;
  _func_int ***local_4d10;
  undefined8 *local_4d08;
  Scene ***local_4d00;
  undefined1 *local_4cf8;
  mvector<PrimRefMB> ***local_4cf0;
  undefined8 local_4ce8;
  undefined4 local_4ce0;
  wait_context local_4cd8;
  task_group_context local_4cc8;
  long local_4c48 [64];
  ulong local_4a48 [64];
  _func_int **local_4848;
  ulong local_4840;
  undefined1 local_4838 [9356];
  float local_23ac [2271];
  
  local_4848 = (_func_int **)0x0;
  local_4e00 = '\x01';
  uVar16 = 0;
  local_4e28 = t0t1;
  local_4e10 = scene;
  local_4e08 = types;
  local_4df8 = prims;
  local_4df0 = sgrids;
  local_4de0 = numPrimRefs;
  (**progressMonitor->_vptr_BuildProgressMonitor)();
  sVar15 = (local_4e10->geometries).size_active;
  if (sVar15 != 0) {
    uVar16 = 0;
    sVar20 = 0;
    do {
      pGVar2 = (local_4e10->geometries).items[sVar20].ptr;
      if ((((pGVar2 == (Geometry *)0x0) || (((uint)pGVar2->field_8 >> 0x15 & 1) == 0)) ||
          ((local_4e08 & 1 << (SUB41(pGVar2->field_8,0) & 0x1f)) == ~MTY_ALL)) ||
         ((bool)local_4e00 != (pGVar2->numTimeSteps != 1))) {
        uVar12 = 0;
      }
      else {
        uVar12 = (ulong)pGVar2->numPrimitives;
      }
      uVar16 = uVar16 + uVar12;
      sVar20 = sVar20 + 1;
    } while (sVar15 != sVar20);
  }
  local_4840 = uVar16;
  iVar8 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  uVar12 = uVar16 + 0x3ff >> 10;
  if ((ulong)(long)iVar8 < uVar12) {
    uVar12 = (long)iVar8;
  }
  uVar17 = 0x40;
  if (uVar12 < 0x40) {
    uVar17 = uVar12;
  }
  local_4848 = (_func_int **)(uVar17 + (uVar17 == 0));
  local_4c48[0] = 0;
  local_4a48[0] = 0;
  if (1 < uVar12) {
    uVar17 = 0;
    uVar12 = uVar16 / (ulong)local_4848;
    pp_Var21 = (_func_int **)0x1;
    lVar22 = 0;
    do {
      pGVar2 = (local_4e10->geometries).items[lVar22].ptr;
      if (((pGVar2 == (Geometry *)0x0) || (((uint)pGVar2->field_8 >> 0x15 & 1) == 0)) ||
         (((local_4e08 & 1 << (SUB41(pGVar2->field_8,0) & 0x1f)) == ~MTY_ALL ||
          ((bool)local_4e00 != (pGVar2->numTimeSteps != 1))))) {
        uVar24 = 0;
      }
      else {
        uVar24 = (ulong)pGVar2->numPrimitives;
      }
      if (uVar24 == 0) {
        lVar14 = 0;
      }
      else {
        uVar13 = ((long)pp_Var21 + 1) * uVar16;
        lVar14 = 0;
        uVar23 = 0;
        do {
          uVar9 = uVar12;
          uVar12 = uVar9;
          if ((uVar24 + uVar17 + lVar14 < uVar9) || (local_4848 <= pp_Var21)) break;
          local_4c48[(long)pp_Var21] = lVar22;
          uVar23 = uVar23 + (uVar9 - uVar17);
          local_4a48[(long)pp_Var21] = uVar23;
          pp_Var21 = (_func_int **)((long)pp_Var21 + 1);
          uVar12 = uVar13 / (ulong)local_4848;
          lVar14 = -uVar23;
          uVar13 = uVar13 + uVar16;
          uVar17 = uVar9;
        } while (uVar23 < uVar24);
      }
      uVar17 = uVar17 + uVar24 + lVar14;
      lVar22 = lVar22 + 1;
    } while (pp_Var21 < local_4848);
  }
  pp_Var21 = local_4848;
  local_4dc8 = 0x7f8000007f800000;
  uStack_4dc0 = 0x7f8000007f800000;
  local_4db8 = 0xff800000ff800000;
  uStack_4db0 = 0xff800000ff800000;
  local_4da8 = 0x7f8000007f800000;
  uStack_4da0 = 0x7f8000007f800000;
  local_4d98 = 0xff800000ff800000;
  uStack_4d90 = 0xff800000ff800000;
  local_4d88 = 0x7f8000007f800000;
  uStack_4d80 = 0x7f8000007f800000;
  local_4d78 = 0xff800000ff800000;
  uStack_4d70 = 0xff800000ff800000;
  local_4d68 = 0;
  uStack_4d60 = 0;
  local_4d58 = 0;
  sStack_4d50 = 0;
  local_4d48 = 0.0;
  fStack_4d44 = 1.0;
  fStack_4d40 = 1.0;
  fStack_4d3c = 0.0;
  local_4d30 = local_4df8;
  local_4d28 = local_4df0;
  local_4d20 = &local_4e28;
  local_4de8 = &local_4e10;
  local_4d00 = &local_4de8;
  local_4cf0 = &local_4dd8;
  local_4d10 = &local_4e30;
  local_4d18 = local_4c48;
  local_4cf8 = &local_4e31;
  local_4cc8.my_version = proxy_support;
  local_4cc8.my_traits = (context_traits)0x4;
  local_4cc8.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_4cc8.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_4cc8.my_name = CUSTOM_CTX;
  local_4e30 = local_4848;
  local_4dd8 = &local_4d30;
  local_4dd0 = local_4de8;
  local_4d08 = &local_4dc8;
  tbb::detail::r1::initialize(&local_4cc8);
  local_4e20 = &local_4d18;
  if (pp_Var21 != (_func_int **)0x0) {
    local_4e18.m_version_and_traits = 0;
    ptVar10 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_4e18,0xc0);
    ptVar10->m_reserved[3] = 0;
    ptVar10->m_reserved[4] = 0;
    ptVar10->m_reserved[1] = 0;
    ptVar10->m_reserved[2] = 0;
    (ptVar10->super_task_traits).m_version_and_traits = 0;
    ptVar10->m_reserved[0] = 0;
    ptVar10->m_reserved[5] = 0;
    ptVar10->_vptr_task = (_func_int **)&PTR__task_02207098;
    ptVar10[1]._vptr_task = pp_Var21;
    ptVar10[1].super_task_traits.m_version_and_traits = 0;
    ptVar10[1].m_reserved[0] = 1;
    ptVar10[1].m_reserved[1] = (uint64_t)&local_4e20;
    ptVar10[1].m_reserved[2] = 0;
    ptVar10[1].m_reserved[3] = 1;
    iVar8 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
    *(undefined4 *)&ptVar10[2]._vptr_task = 0;
    *(undefined1 *)((long)&ptVar10[2]._vptr_task + 4) = 5;
    ptVar10[1].m_reserved[5] = ((long)iVar8 & 0x3fffffffffffffffU) * 2;
    ptVar10[2].super_task_traits.m_version_and_traits = local_4e18.m_version_and_traits;
    local_4ce8 = 0;
    local_4ce0 = 1;
    local_4cd8.m_version_and_traits = 1;
    local_4cd8.m_ref_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1
    ;
    ptVar10[1].m_reserved[4] = (uint64_t)&local_4ce8;
    tbb::detail::r1::execute_and_wait(ptVar10,&local_4cc8,&local_4cd8,&local_4cc8);
  }
  cVar7 = tbb::detail::r1::is_group_execution_cancelled(&local_4cc8);
  if (cVar7 != '\0') {
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar11,"task cancelled");
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy(&local_4cc8);
  aVar26._8_8_ = uStack_4dc0;
  aVar26._0_8_ = local_4dc8;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar26;
  aVar27._8_8_ = uStack_4db0;
  aVar27._0_8_ = local_4db8;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar27;
  aVar29._8_8_ = uStack_4da0;
  aVar29._0_8_ = local_4da8;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar29;
  aVar31._8_8_ = uStack_4d90;
  aVar31._0_8_ = local_4d98;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar31;
  aVar33._8_8_ = uStack_4d80;
  aVar33._0_8_ = local_4d88;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar33;
  aVar35._8_8_ = uStack_4d70;
  aVar35._0_8_ = local_4d78;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar35;
  (__return_storage_ptr__->object_range)._begin = local_4d68;
  (__return_storage_ptr__->object_range)._end = uStack_4d60;
  BVar40.upper = fStack_4d44;
  BVar40.lower = local_4d48;
  BVar6.upper = fStack_4d3c;
  BVar6.lower = fStack_4d40;
  __return_storage_ptr__->max_time_range = BVar40;
  __return_storage_ptr__->time_range = BVar6;
  __return_storage_ptr__->num_time_segments = local_4d58;
  __return_storage_ptr__->max_num_time_segments = sStack_4d50;
  if (local_4e30 != (_func_int **)0x0) {
    sVar15 = __return_storage_ptr__->num_time_segments;
    pauVar18 = (undefined1 (*) [16])local_4838;
    BVar40 = __return_storage_ptr__->max_time_range;
    uVar41 = (__return_storage_ptr__->object_range)._begin;
    uVar42 = (__return_storage_ptr__->object_range)._end;
    sVar20 = __return_storage_ptr__->max_num_time_segments;
    pp_Var21 = local_4e30;
    fVar43 = (__return_storage_ptr__->time_range).upper;
    fVar37 = (__return_storage_ptr__->time_range).lower;
    do {
      uVar12 = *(ulong *)(pauVar18[7] + 8);
      uVar16 = *(ulong *)pauVar18[8];
      fVar1 = *(float *)(pauVar18[8] + 0xc);
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar18 + 0x240) = aVar26;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar18 + 0x241) = aVar27;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar18 + 0x242) = aVar29;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar18 + 0x243) = aVar31;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar18 + 0x244) = aVar33;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar18 + 0x245) = aVar35;
      aVar26.m128 = (__m128)minps(aVar26.m128,*pauVar18);
      aVar27.m128 = (__m128)maxps(aVar27.m128,pauVar18[1]);
      aVar29.m128 = (__m128)minps(aVar29.m128,pauVar18[2]);
      aVar31.m128 = (__m128)maxps(aVar31.m128,pauVar18[3]);
      aVar33.m128 = (__m128)minps(aVar33.m128,pauVar18[4]);
      aVar35.m128 = (__m128)maxps(aVar35.m128,pauVar18[5]);
      fVar38 = fVar37;
      if (*(float *)(pauVar18[8] + 8) <= fVar37) {
        fVar38 = *(float *)(pauVar18[8] + 8);
      }
      sVar15 = sVar15 + *(long *)pauVar18[7];
      uVar3 = (__return_storage_ptr__->object_range)._end;
      sVar4 = __return_storage_ptr__->num_time_segments;
      sVar5 = __return_storage_ptr__->max_num_time_segments;
      *(unsigned_long *)pauVar18[0x246] = (__return_storage_ptr__->object_range)._begin;
      *(unsigned_long *)(pauVar18[0x246] + 8) = uVar3;
      *(size_t *)pauVar18[0x247] = sVar4;
      *(size_t *)(pauVar18[0x247] + 8) = sVar5;
      *(BBox1f *)(pauVar18 + 0x248) = BVar40;
      *(float *)(pauVar18[0x248] + 8) = fVar37;
      *(float *)(pauVar18[0x248] + 0xc) = fVar43;
      if (fVar1 <= fVar43) {
        fVar1 = fVar43;
      }
      uVar17 = CONCAT44((int)((uint)(sVar20 < uVar12) << 0x1f) >> 0x1f,
                        (int)((uint)(sVar20 < uVar12) << 0x1f) >> 0x1f);
      if (sVar20 <= uVar12) {
        sVar20 = uVar12;
      }
      BVar40 = (BBox1f)(~uVar17 & (ulong)BVar40 | uVar16 & uVar17);
      uVar41 = uVar41 + *(long *)pauVar18[6];
      uVar42 = uVar42 + *(long *)(pauVar18[6] + 8);
      (__return_storage_ptr__->object_range)._begin = uVar41;
      (__return_storage_ptr__->object_range)._end = uVar42;
      __return_storage_ptr__->num_time_segments = sVar15;
      __return_storage_ptr__->max_num_time_segments = sVar20;
      pauVar18 = pauVar18 + 9;
      pp_Var21 = (_func_int **)((long)pp_Var21 + -1);
      fVar43 = fVar1;
      fVar37 = fVar38;
    } while (pp_Var21 != (_func_int **)0x0);
    __return_storage_ptr__->max_time_range = BVar40;
    (__return_storage_ptr__->time_range).lower = fVar38;
    (__return_storage_ptr__->time_range).upper = fVar1;
  }
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar26;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar27;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar29;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar31;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar33;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar35;
  if ((__return_storage_ptr__->object_range)._end - (__return_storage_ptr__->object_range)._begin !=
      local_4de0) {
    (**progressMonitor->_vptr_BuildProgressMonitor)(progressMonitor,0);
    pp_Var21 = local_4848;
    local_4dc8 = 0x7f8000007f800000;
    uStack_4dc0 = 0x7f8000007f800000;
    local_4db8 = 0xff800000ff800000;
    uStack_4db0 = 0xff800000ff800000;
    local_4da8 = 0x7f8000007f800000;
    uStack_4da0 = 0x7f8000007f800000;
    local_4d98 = 0xff800000ff800000;
    uStack_4d90 = 0xff800000ff800000;
    local_4d88 = 0x7f8000007f800000;
    uStack_4d80 = 0x7f8000007f800000;
    local_4d78 = 0xff800000ff800000;
    uStack_4d70 = 0xff800000ff800000;
    local_4d68 = 0;
    uStack_4d60 = 0;
    local_4d58 = 0;
    sStack_4d50 = 0;
    local_4d48 = 0.0;
    fStack_4d44 = 1.0;
    fStack_4d40 = 1.0;
    fStack_4d3c = 0.0;
    local_4d30 = local_4df8;
    local_4d28 = local_4df0;
    local_4d20 = &local_4e28;
    local_4de8 = &local_4e10;
    local_4e30 = local_4848;
    local_4d18 = local_4c48;
    local_4d10 = &local_4e30;
    local_4cf8 = &local_4e31;
    local_4cf0 = &local_4dd8;
    local_4cc8.my_version = proxy_support;
    local_4cc8.my_traits = (context_traits)0x4;
    local_4cc8.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_4cc8.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_4cc8.my_name = CUSTOM_CTX;
    local_4dd8 = &local_4d30;
    local_4dd0 = local_4de8;
    local_4d08 = &local_4dc8;
    local_4d00 = &local_4de8;
    tbb::detail::r1::initialize(&local_4cc8);
    local_4e20 = &local_4d18;
    if (pp_Var21 != (_func_int **)0x0) {
      local_4e18.m_version_and_traits = 0;
      ptVar10 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_4e18,0xc0);
      ptVar10->m_reserved[3] = 0;
      ptVar10->m_reserved[4] = 0;
      ptVar10->m_reserved[1] = 0;
      ptVar10->m_reserved[2] = 0;
      (ptVar10->super_task_traits).m_version_and_traits = 0;
      ptVar10->m_reserved[0] = 0;
      ptVar10->m_reserved[5] = 0;
      ptVar10->_vptr_task = (_func_int **)&PTR__task_022070e0;
      ptVar10[1]._vptr_task = pp_Var21;
      ptVar10[1].super_task_traits.m_version_and_traits = 0;
      ptVar10[1].m_reserved[0] = 1;
      ptVar10[1].m_reserved[1] = (uint64_t)&local_4e20;
      ptVar10[1].m_reserved[2] = 0;
      ptVar10[1].m_reserved[3] = 1;
      iVar8 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
      *(undefined4 *)&ptVar10[2]._vptr_task = 0;
      *(undefined1 *)((long)&ptVar10[2]._vptr_task + 4) = 5;
      ptVar10[1].m_reserved[5] = ((long)iVar8 & 0x3fffffffffffffffU) * 2;
      ptVar10[2].super_task_traits.m_version_and_traits = local_4e18.m_version_and_traits;
      local_4ce8 = 0;
      local_4ce0 = 1;
      local_4cd8.m_version_and_traits = 1;
      local_4cd8.m_ref_count.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)1;
      ptVar10[1].m_reserved[4] = (uint64_t)&local_4ce8;
      tbb::detail::r1::execute_and_wait(ptVar10,&local_4cc8,&local_4cd8,&local_4cc8);
    }
    cVar7 = tbb::detail::r1::is_group_execution_cancelled(&local_4cc8);
    if (cVar7 != '\0') {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar11,"task cancelled");
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_4cc8);
    aVar39._8_8_ = uStack_4dc0;
    aVar39._0_8_ = local_4dc8;
    aVar36._8_8_ = uStack_4db0;
    aVar36._0_8_ = local_4db8;
    aVar34._8_8_ = uStack_4da0;
    aVar34._0_8_ = local_4da8;
    aVar32._8_8_ = uStack_4d90;
    aVar32._0_8_ = local_4d98;
    aVar30._8_8_ = uStack_4d80;
    aVar30._0_8_ = local_4d88;
    aVar28._8_8_ = uStack_4d70;
    aVar28._0_8_ = local_4d78;
    BVar44.upper = fStack_4d44;
    BVar44.lower = local_4d48;
    if (local_4e30 != (_func_int **)0x0) {
      pfVar19 = local_23ac;
      fVar43 = fStack_4d3c;
      do {
        uVar16 = *(ulong *)(pfVar19 + -0x905);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pfVar19 + -0x23) = aVar39;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pfVar19 + -0x1f) = aVar36;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pfVar19 + -0x1b) = aVar34;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pfVar19 + -0x17) = aVar32;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pfVar19 + -0x13) = aVar30;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pfVar19 + -0xf) = aVar28;
        *(unsigned_long *)(pfVar19 + -0xb) = local_4d68;
        *(unsigned_long *)(pfVar19 + -9) = uStack_4d60;
        *(size_t *)(pfVar19 + -7) = local_4d58;
        *(size_t *)(pfVar19 + -5) = sStack_4d50;
        *(BBox1f *)(pfVar19 + -3) = BVar44;
        pfVar19[-1] = fStack_4d40;
        *pfVar19 = fVar43;
        aVar39.m128 = (__m128)minps(aVar39.m128,*(undefined1 (*) [16])(pfVar19 + -0x923));
        aVar36.m128 = (__m128)maxps(aVar36.m128,*(undefined1 (*) [16])(pfVar19 + -0x91f));
        aVar34.m128 = (__m128)minps(aVar34.m128,*(undefined1 (*) [16])(pfVar19 + -0x91b));
        aVar32.m128 = (__m128)maxps(aVar32.m128,*(undefined1 (*) [16])(pfVar19 + -0x917));
        aVar30.m128 = (__m128)minps(aVar30.m128,*(undefined1 (*) [16])(pfVar19 + -0x913));
        aVar28.m128 = (__m128)maxps(aVar28.m128,*(undefined1 (*) [16])(pfVar19 + -0x90f));
        if (pfVar19[-0x901] <= fStack_4d40) {
          fStack_4d40 = pfVar19[-0x901];
        }
        local_4d68 = local_4d68 + *(long *)(pfVar19 + -0x90b);
        uStack_4d60 = uStack_4d60 + *(long *)(pfVar19 + -0x909);
        fStack_4d3c = pfVar19[-0x900];
        if (pfVar19[-0x900] <= fVar43) {
          fStack_4d3c = fVar43;
        }
        local_4d58 = local_4d58 + *(long *)(pfVar19 + -0x907);
        bVar25 = sStack_4d50 < uVar16;
        if (sStack_4d50 <= uVar16) {
          sStack_4d50 = uVar16;
        }
        uVar16 = CONCAT44((int)((uint)bVar25 << 0x1f) >> 0x1f,(int)((uint)bVar25 << 0x1f) >> 0x1f);
        BVar44 = (BBox1f)(~uVar16 & (ulong)BVar44 | *(ulong *)(pfVar19 + -0x903) & uVar16);
        pfVar19 = pfVar19 + 0x24;
        local_4e30 = (_func_int **)((long)local_4e30 + -1);
        fVar43 = fStack_4d3c;
      } while (local_4e30 != (_func_int **)0x0);
    }
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
    lower.field_0 = aVar39;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
    upper.field_0 = aVar36;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
    lower.field_0 = aVar34;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
    upper.field_0 = aVar32;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.
    field_0 = aVar30;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.
    field_0 = aVar28;
    (__return_storage_ptr__->object_range)._begin = local_4d68;
    (__return_storage_ptr__->object_range)._end = uStack_4d60;
    __return_storage_ptr__->num_time_segments = local_4d58;
    __return_storage_ptr__->max_num_time_segments = sStack_4d50;
    __return_storage_ptr__->max_time_range = BVar44;
    (__return_storage_ptr__->time_range).lower = fStack_4d40;
    (__return_storage_ptr__->time_range).upper = fStack_4d3c;
  }
  __return_storage_ptr__->time_range = local_4e28;
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefArrayMSMBlur(Scene* scene, Geometry::GTypeMask types, const size_t numPrimRefs, mvector<PrimRefMB>& prims, mvector<SubGridBuildData>& sgrids, BuildProgressMonitor& progressMonitor, BBox1f t0t1)
    {
      ParallelForForPrefixSumState<PrimInfoMB> pstate;
      Scene::Iterator2 iter(scene,types,true);
      
      /* first try */
      progressMonitor(0);
      pstate.init(iter,size_t(1024));
      PrimInfoMB pinfo = parallel_for_for_prefix_sum0( pstate, iter, PrimInfoMB(empty), [&](Geometry* mesh, const range<size_t>& r, size_t k, size_t geomID) -> PrimInfoMB {
         return mesh->createPrimRefMBArray(prims,sgrids,t0t1,r,k,(unsigned)geomID);
      }, [](const PrimInfoMB& a, const PrimInfoMB& b) -> PrimInfoMB { return PrimInfoMB::merge2(a,b); });
      
      /* if we need to filter out geometry, run again */
      if (pinfo.size() != numPrimRefs)
      {
        progressMonitor(0);
        pinfo = parallel_for_for_prefix_sum1( pstate, iter, PrimInfoMB(empty), [&](Geometry* mesh, const range<size_t>& r, size_t k, size_t geomID, const PrimInfoMB& base) -> PrimInfoMB {
          return mesh->createPrimRefMBArray(prims,sgrids,t0t1,r,base.size(),(unsigned)geomID);
        }, [](const PrimInfoMB& a, const PrimInfoMB& b) -> PrimInfoMB { return PrimInfoMB::merge2(a,b); });
      }

      /* the BVH starts with that time range, even though primitives might have smaller/larger time range */
      pinfo.time_range = t0t1;
      return pinfo;
    }